

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DVector3 * __thiscall
AActor::InterpolatedPosition(DVector3 *__return_storage_ptr__,AActor *this,double ticFrac)

{
  DVector3 local_68;
  TVector3<double> local_50;
  TVector3<double> local_38;
  double local_20;
  double ticFrac_local;
  AActor *this_local;
  
  local_20 = ticFrac;
  ticFrac_local = (double)this;
  this_local = (AActor *)__return_storage_ptr__;
  Pos(&local_68,this);
  TVector3<double>::operator-(&local_50,&local_68,&this->Prev);
  ::operator*(&local_38,ticFrac,&local_50);
  TVector3<double>::operator+(__return_storage_ptr__,&this->Prev,&local_38);
  return __return_storage_ptr__;
}

Assistant:

DVector3 InterpolatedPosition(double ticFrac) const
	{
		return Prev + (ticFrac * (Pos() - Prev));
	}